

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_simd.cpp
# Opt level: O2

void compute_integral_img_simd_int(uint8_t *gray_image,integral_image *iimage)

{
  float *pfVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  undefined1 auVar6 [32];
  ulong uVar7;
  ulong uVar8;
  size_t i;
  ulong uVar9;
  size_t j;
  long lVar10;
  float *pfVar11;
  byte *pbVar12;
  float *pfVar13;
  long lVar14;
  float fVar15;
  int iVar16;
  float *pfVar17;
  long lVar18;
  ulong uVar19;
  size_t i_1;
  byte *pbVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [64];
  undefined1 in_XMM5 [16];
  
  auVar6 = _DAT_0015e220;
  iVar3 = iimage->width;
  uVar8 = (ulong)iVar3;
  lVar14 = (long)iimage->data_width;
  iVar4 = iimage->height;
  pfVar5 = iimage->data;
  auVar23 = ZEXT1664((undefined1  [16])0x0);
  uVar7 = (ulong)(iVar3 / 4 << 2);
  for (uVar9 = 0; uVar9 < uVar7; uVar9 = uVar9 + 4) {
    auVar22 = vpermt2b_avx512vl(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar6,
                                ZEXT432(*(uint *)(gray_image + uVar9)));
    auVar22 = vpsadbw_avx2(auVar22,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar22 = vpaddd_avx2(auVar22,auVar23._0_32_);
    auVar21 = vpmovqd_avx512vl(auVar22);
    *(undefined1 (*) [16])(pfVar5 + uVar9) = auVar21;
    auVar22 = vpermq_avx2(auVar22,0xff);
    auVar23 = ZEXT3264(auVar22);
  }
  fVar15 = pfVar5[uVar9 - 1];
  for (; uVar9 < uVar8; uVar9 = uVar9 + 1) {
    fVar15 = (float)((int)fVar15 + (uint)gray_image[uVar9]);
    pfVar5[uVar9] = fVar15;
  }
  pbVar12 = gray_image + uVar8;
  lVar10 = 0;
  pfVar11 = pfVar5;
  for (uVar9 = 1; uVar9 < (ulong)(long)iVar4; uVar9 = uVar9 + 1) {
    auVar23 = ZEXT1664((undefined1  [16])0x0);
    lVar18 = lVar10;
    pbVar20 = pbVar12;
    for (uVar19 = 0; uVar19 < uVar7; uVar19 = uVar19 + 4) {
      lVar18 = lVar18 + 0x10;
      pbVar20 = pbVar20 + 4;
      auVar22 = vpermt2b_avx512vl(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar6,
                                  ZEXT432(*(uint *)(pbVar12 + uVar19)));
      auVar22 = vpsadbw_avx2(auVar22,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar22 = vpaddd_avx2(auVar22,auVar23._0_32_);
      auVar21 = vpmovqd_avx512vl(auVar22);
      auVar21 = vpaddd_avx(auVar21,*(undefined1 (*) [16])(pfVar11 + uVar19));
      auVar22 = vpermq_avx2(auVar22,0xff);
      auVar23 = ZEXT3264(auVar22);
      *(undefined1 (*) [16])(pfVar11 + lVar14 + uVar19) = auVar21;
    }
    iVar16 = (int)pfVar11[uVar19 + lVar14 + -1] - (int)pfVar11[uVar19 - 1];
    for (; uVar19 < uVar8; uVar19 = uVar19 + 1) {
      bVar2 = *pbVar20;
      pbVar20 = pbVar20 + 1;
      iVar16 = iVar16 + (uint)bVar2;
      *(int *)((long)pfVar5 + lVar18 + lVar14 * 4) = *(int *)((long)pfVar5 + lVar18) + iVar16;
      lVar18 = lVar18 + 4;
    }
    pbVar12 = pbVar12 + uVar8;
    lVar10 = lVar10 + lVar14 * 4;
    pfVar11 = pfVar11 + lVar14;
  }
  lVar10 = 0;
  pfVar11 = iimage->data;
  pfVar13 = pfVar11;
  pfVar17 = pfVar5;
  for (uVar7 = 0; uVar7 != (long)iVar4; uVar7 = uVar7 + 1) {
    lVar18 = lVar10;
    for (uVar9 = 0; uVar9 < (ulong)(long)(iVar3 + -7); uVar9 = uVar9 + 8) {
      auVar6 = vcvtdq2ps_avx(*(undefined1 (*) [32])(pfVar17 + uVar9));
      lVar18 = lVar18 + 0x20;
      pfVar1 = pfVar13 + uVar9;
      *pfVar1 = auVar6._0_4_ * 0.003921569;
      pfVar1[1] = auVar6._4_4_ * 0.003921569;
      pfVar1[2] = auVar6._8_4_ * 0.003921569;
      pfVar1[3] = auVar6._12_4_ * 0.003921569;
      pfVar1[4] = auVar6._16_4_ * 0.003921569;
      pfVar1[5] = auVar6._20_4_ * 0.003921569;
      pfVar1[6] = auVar6._24_4_ * 0.003921569;
      pfVar1[7] = auVar6._28_4_;
    }
    for (; uVar9 < uVar8; uVar9 = uVar9 + 1) {
      auVar21 = vcvtusi2ss_avx512f(in_XMM5,*(undefined4 *)((long)pfVar5 + lVar18));
      *(float *)((long)pfVar11 + lVar18) = auVar21._0_4_ * 0.003921569;
      lVar18 = lVar18 + 4;
    }
    pfVar17 = pfVar17 + lVar14;
    pfVar13 = pfVar13 + lVar14;
    lVar10 = lVar10 + lVar14 * 4;
  }
  return;
}

Assistant:

void compute_integral_img_simd_int(uint8_t *gray_image, struct integral_image *iimage) {
    
    // Implementation adapted from:
    // https://stackoverflow.com/questions/46520275/how-to-speed-up-calculation-of-integral-image
    // https://github.com/ermig1979/Simd/blob/master/src/Simd/SimdAvx2Integral.cpp

    int data_width = iimage->data_width;
    int width = iimage->width;
    int height = iimage->height;

    __m256i MASK = _mm256_setr_epi64x(0x00000000000000FF, 0x000000000000FFFF, 0x0000000000FFFFFF, 0x00000000FFFFFFFF);
    __m256i PACK = _mm256_setr_epi32(0, 2, 4, 6, 1, 3, 5, 7);
    //__m256i ZERO = _mm256_set1_epi32(0);
    __m256i ZERO = _mm256_setzero_si256();

    uint32_t *iimage_idata = (uint32_t *) iimage->data;

    size_t aligned_width = width / 4 * 4;

    {
        __m256i row_sums = ZERO;
        size_t i = 0;
        for(; i < aligned_width; i+=4) {

            // If (gray_image + i) has following uint8_t pixels: a b c d
            // a0000000 ab000000 abc00000 abcd0000
            __m256i img_rep_mask = _mm256_and_si256(_mm256_set1_epi32(*(uint32_t*)(gray_image + i)), MASK);
            
            // Summing together blocks of 8 uint8_t's and storing results
            // uint32_t eeee = a
            // uint32_t ffff = a + b
            // uint32_t gggg = a + b + c
            // uint32_t hhhh = a + b + c + d
            // eeee0000 ffff0000 gggg0000 hhhh0000
            __m256i img_sad_sum = _mm256_sad_epu8(img_rep_mask, ZERO);

            // Updating row_sum by adding previously computed img_sad_sum
            //   eeee0000 ffff0000 hhhh0000 hhhh0000
            // + iiii**** jjjj**** kkkk**** llll****
            // -------------------------------------
            //   mmmm**** nnnn**** oooo**** pppp****
            row_sums = _mm256_add_epi32(row_sums, img_sad_sum);

            // Permuting row_sum from first row to second and cutting off upper 128 bits
            // mmmm**** nnnn**** oooo**** pppp****
            // mmmmnnnn oooopppp ******** ********
            __m128i curr_row_sums = _mm256_castsi256_si128(_mm256_permutevar8x32_epi32(row_sums, PACK));
            
            // Storing 128 bits (4*uint32_t) in curr_row_sums back to memory
            // 
            _mm_storeu_si128((__m128i*)(iimage_idata + i), curr_row_sums); // For unaligned
            //_mm_store_si128((__m128i *)(iimage_idata + i), curr_row_sums);
            
            // Updating row_sums to only include highest of four values (pppp)
            // mmmm**** nnnn**** oooo**** pppp****
            // pppp**** pppp**** pppp**** pppp****
            row_sums = _mm256_permute4x64_epi64(row_sums, 0xFF);

        }
        uint32_t row_sum = iimage_idata[i - 1];
        for (; i < width; ++i) {
            row_sum += gray_image[i];
            iimage_idata[i] = row_sum;
        }
    }

    for(size_t j = 1; j < height; ++j) {

        __m256i row_sums = ZERO;

        size_t i = 0;
        for(; i < aligned_width; i+=4) {

            // If (gray_image + i) has following uint8_t pixels: a b c d
            // a0000000 ab000000 abc00000 abcd0000
            __m256i img_rep_mask = _mm256_and_si256(_mm256_set1_epi32(*(uint32_t*)(gray_image + j * width + i)), MASK);
            
            // Summing together blocks of 8 uint8_t's and storing results
            // uint32_t eeee = a
            // uint32_t ffff = a + b
            // uint32_t gggg = a + b + c
            // uint32_t hhhh = a + b + c + d
            // eeee0000 ffff0000 gggg0000 hhhh0000
            __m256i img_sad_sum = _mm256_sad_epu8(img_rep_mask, ZERO);

            // Updating row_sum by adding previously computed img_sad_sum
            //   eeee0000 ffff0000 hhhh0000 hhhh0000
            // + iiii**** jjjj**** kkkk**** llll****
            // -------------------------------------
            //   mmmm**** nnnn**** oooo**** pppp****
            row_sums = _mm256_add_epi32(row_sums, img_sad_sum);

            // Permuting row_sum from first row to second and cutting off upper 128 bits
            // mmmm**** nnnn**** oooo**** pppp****
            // mmmmnnnn oooopppp ******** ********
            __m128i curr_row_sums = _mm256_castsi256_si128(_mm256_permutevar8x32_epi32(row_sums, PACK));

            // Loading row_sum from previous row
            __m128i prev_row_sums = _mm_loadu_si128((__m128i *)(iimage_idata + (j-1) * data_width + i));
            //__m128i prev_row_sums = _mm_load_si128((__m128i *)(iimage_idata + (j-1) * data_width + i));

            // Adding curr_row_sums with prev_row_sums
            __m128i add_row_sums = _mm_add_epi32(curr_row_sums, prev_row_sums);

            // Storing 128 bits (4*uint32_t) in curr_row_sums back to memory
            _mm_storeu_si128((__m128i *)(iimage_idata + j * data_width + i), add_row_sums); // For unaligned
            //_mm_store_si128((__m128i *)(iimage_idata + j * data_width + i), add_row_sums);
            
            // Updating row_sums to only include highest of four values (pppp)
            // mmmm**** nnnn**** oooo**** pppp****
            // pppp**** pppp**** pppp**** pppp****
            row_sums = _mm256_permute4x64_epi64(row_sums, 0xFF);

        }

        uint32_t row_sum = iimage_idata[j * data_width + i - 1] - iimage_idata[(j-1) * data_width + i - 1];
        for (; i < width; ++i) {
            row_sum += gray_image[j * width + i];
            iimage_idata[j * data_width + i] = row_sum + iimage_idata[(j-1) * data_width + i];
        }

    }

    
    float *iimage_data = iimage->data;

    __m256 factor = _mm256_set1_ps(1.0f / 255.0f);

    for (size_t j = 0; j < height; ++j) {

        size_t i = 0;
        for (; i < width - 7; i+=8) {

            __m256i v_int = _mm256_loadu_si256((__m256i *)(iimage_idata + j * data_width + i));
            //__m256i v_int = _mm256_load_si256((__m256i *)(iimage_idata + j * data_width + i));

            // AVX512 only :(
            //__m256 v_float = _mm256_cvtepu32_ps(v_int);
            __m256 v_float = _mm256_cvtepi32_ps(v_int);
            //__m256 v_float = _my_mm256_cvtepu32_ps(v_int);

            // Multiplying converted float with (1.0f/255.0f) 
            __m256 v_iimage = _mm256_mul_ps(factor, v_float);

            // Storing value back to memory
            _mm256_storeu_ps(iimage_data + j * data_width + i, v_iimage);

        } 

        for (; i < width; ++i) {
            iimage_data[j * data_width + i] = (1.0f / 255.0f) * ((float) iimage_idata[j * data_width + i]);
        }

    }
    

}